

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_col_block_list(Integer s_a,Integer **idx,Integer *n)

{
  long lVar1;
  void *pvVar2;
  Integer *in_RDX;
  long *in_RSI;
  long in_RDI;
  Integer index;
  Integer i;
  Integer hdl;
  long local_28;
  
  lVar1 = in_RDI + 1000;
  *in_RDX = SPA[lVar1].nblocks;
  pvVar2 = malloc(SPA[lVar1].nblocks << 3);
  *in_RSI = (long)pvVar2;
  for (local_28 = 0; local_28 < SPA[lVar1].nblocks; local_28 = local_28 + 1) {
    *(Integer *)(*in_RSI + local_28 * 8) = SPA[lVar1].blkidx[local_28];
  }
  return;
}

Assistant:

void pnga_sprs_array_col_block_list(Integer s_a, Integer **idx, Integer *n)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer i, index;
  *n = SPA[hdl].nblocks;
  *idx = (Integer*)malloc(SPA[hdl].nblocks*sizeof(Integer));
  for (i=0; i<SPA[hdl].nblocks; i++) {
    (*idx)[i] = SPA[hdl].blkidx[i];
  }
}